

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

void tchecker::refdbm::asynchronous_open_up(db_t *rdbm,reference_clock_variables_t *r)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2bf,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar2 = is_consistent(rdbm,r);
  if (!bVar2) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2c0,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar2 = is_tight(rdbm,r);
  if (!bVar2) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2c1,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  sVar3 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)r);
  uVar1 = r->_refcount;
  for (uVar4 = 0; uVar5 = sVar3 & 0xffffffff, uVar6 = uVar4, uVar4 != uVar1; uVar4 = uVar4 + 1) {
    while (bVar2 = uVar5 != 0, uVar5 = uVar5 - 1, bVar2) {
      rdbm[uVar6 & 0xffffffff] = (db_t)0x7ffffffe;
      uVar6 = uVar6 + sVar3;
    }
    rdbm[(uint)(((int)sVar3 + 1) * (int)uVar4)] = (db_t)0x1;
  }
  bVar2 = is_consistent(rdbm,r);
  if (bVar2) {
    bVar2 = is_tight(rdbm,r);
    if (bVar2) {
      return;
    }
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2cf,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0x2ce,
                "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
               );
}

Assistant:

void asynchronous_open_up(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));

  // x - r < inf for all clock x and reference clock r (including x being a
  // reference clock)
  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const refcount = r.refcount();

  for (tchecker::clock_id_t t = 0; t < refcount; ++t) {
    for (tchecker::clock_id_t x = 0; x < rdim; ++x)
      RDBM(x, t) = tchecker::dbm::LT_INFINITY;
    RDBM(t, t) = tchecker::dbm::LE_ZERO;
  }

  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));
}